

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O0

int __thiscall delaunator::Delaunator::link(Delaunator *this,char *__from,char *__to)

{
  size_t sVar1;
  int iVar2;
  size_type sVar3;
  reference extraout_RAX;
  reference extraout_RAX_00;
  reference pvVar4;
  runtime_error *prVar5;
  size_t s2;
  size_t s;
  size_t b_local;
  size_t a_local;
  Delaunator *this_local;
  
  s = (size_t)__to;
  b_local = (size_t)__from;
  a_local = (size_t)this;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->halfedges);
  sVar1 = s;
  if (b_local == sVar3) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->halfedges,&s);
    pvVar4 = extraout_RAX;
  }
  else {
    if (sVar3 <= b_local) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Cannot link edge");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->halfedges,b_local);
    *pvVar4 = sVar1;
  }
  iVar2 = (int)pvVar4;
  if (s != 0xffffffffffffffff) {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->halfedges);
    sVar1 = b_local;
    if (s == sVar3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->halfedges,&b_local);
      pvVar4 = extraout_RAX_00;
    }
    else {
      if (sVar3 <= s) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Cannot link edge");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->halfedges,s);
      *pvVar4 = sVar1;
    }
    iVar2 = (int)pvVar4;
  }
  return iVar2;
}

Assistant:

void Delaunator::link(const std::size_t a, const std::size_t b) {
    std::size_t s = halfedges.size();
    if (a == s) {
        halfedges.push_back(b);
    } else if (a < s) {
        halfedges[a] = b;
    } else {
        throw std::runtime_error("Cannot link edge");
    }
    if (b != INVALID_INDEX) {
        std::size_t s2 = halfedges.size();
        if (b == s2) {
            halfedges.push_back(a);
        } else if (b < s2) {
            halfedges[b] = a;
        } else {
            throw std::runtime_error("Cannot link edge");
        }
    }
}